

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_noise.c
# Opt level: O3

noise_stats_t * fe_init_noisestats(int num_filters)

{
  noise_stats_t *pnVar1;
  powspec_t *ppVar2;
  size_t n_elem;
  
  pnVar1 = (noise_stats_t *)
           __ckd_calloc__(1,0xd8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_noise.c"
                          ,0xf4);
  n_elem = (size_t)num_filters;
  ppVar2 = (powspec_t *)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_noise.c"
                          ,0xf7);
  pnVar1->power = ppVar2;
  ppVar2 = (powspec_t *)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_noise.c"
                          ,0xf9);
  pnVar1->noise = ppVar2;
  ppVar2 = (powspec_t *)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_noise.c"
                          ,0xfb);
  pnVar1->floor = ppVar2;
  ppVar2 = (powspec_t *)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_noise.c"
                          ,0xfd);
  pnVar1->peak = ppVar2;
  pnVar1->undefined = '\x01';
  pnVar1->num_filters = num_filters;
  pnVar1->lambda_power = 0.7;
  pnVar1->comp_lambda_power = 0.30000000000000004;
  pnVar1->lambda_a = 0.995;
  pnVar1->comp_lambda_a = 0.0050000000000000044;
  pnVar1->lambda_b = 0.5;
  pnVar1->comp_lambda_b = 0.5;
  pnVar1->lambda_t = 0.85;
  pnVar1->mu_t = 0.2;
  pnVar1->max_gain = 20.0;
  pnVar1->inv_max_gain = 0.05;
  pnVar1->smooth_scaling[1] = 1.0;
  pnVar1->smooth_scaling[2] = 0.5;
  pnVar1->smooth_scaling[3] = 0.3333333333333333;
  pnVar1->smooth_scaling[4] = 0.25;
  pnVar1->smooth_scaling[5] = 0.2;
  pnVar1->smooth_scaling[6] = 0.16666666666666666;
  pnVar1->smooth_scaling[7] = 0.14285714285714285;
  pnVar1->smooth_scaling[8] = 0.125;
  return pnVar1;
}

Assistant:

noise_stats_t *
fe_init_noisestats(int num_filters)
{
    int i;
    noise_stats_t *noise_stats;

    noise_stats = (noise_stats_t *) ckd_calloc(1, sizeof(noise_stats_t));

    noise_stats->power =
        (powspec_t *) ckd_calloc(num_filters, sizeof(powspec_t));
    noise_stats->noise =
        (powspec_t *) ckd_calloc(num_filters, sizeof(powspec_t));
    noise_stats->floor =
        (powspec_t *) ckd_calloc(num_filters, sizeof(powspec_t));
    noise_stats->peak =
        (powspec_t *) ckd_calloc(num_filters, sizeof(powspec_t));

    noise_stats->undefined = TRUE;
    noise_stats->num_filters = num_filters;

#ifndef FIXED_POINT
    noise_stats->lambda_power = LAMBDA_POWER;
    noise_stats->comp_lambda_power = 1 - LAMBDA_POWER;
    noise_stats->lambda_a = LAMBDA_A;
    noise_stats->comp_lambda_a = 1 - LAMBDA_A;
    noise_stats->lambda_b = LAMBDA_B;
    noise_stats->comp_lambda_b = 1 - LAMBDA_B;
    noise_stats->lambda_t = LAMBDA_T;
    noise_stats->mu_t = MU_T;
    noise_stats->max_gain = MAX_GAIN;
    noise_stats->inv_max_gain = 1.0 / MAX_GAIN;
    
    for (i = 1; i < 2 * SMOOTH_WINDOW + 1; i++) {
        noise_stats->smooth_scaling[i] = 1.0 / i;
    }
#else
    noise_stats->lambda_power = FLOAT2FIX(log(LAMBDA_POWER));
    noise_stats->comp_lambda_power = FLOAT2FIX(log(1 - LAMBDA_POWER));
    noise_stats->lambda_a = FLOAT2FIX(log(LAMBDA_A));
    noise_stats->comp_lambda_a = FLOAT2FIX(log(1 - LAMBDA_A));
    noise_stats->lambda_b = FLOAT2FIX(log(LAMBDA_B));
    noise_stats->comp_lambda_b = FLOAT2FIX(log(1 - LAMBDA_B));
    noise_stats->lambda_t = FLOAT2FIX(log(LAMBDA_T));
    noise_stats->mu_t = FLOAT2FIX(log(MU_T));
    noise_stats->max_gain = FLOAT2FIX(log(MAX_GAIN));
    noise_stats->inv_max_gain = FLOAT2FIX(log(1.0 / MAX_GAIN));

    for (i = 1; i < 2 * SMOOTH_WINDOW + 3; i++) {
        noise_stats->smooth_scaling[i] = FLOAT2FIX(log(i));
    }
#endif

#ifdef VAD_DEBUG
    vad_stats = fopen("vad_debug", "w");
#endif

    return noise_stats;
}